

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O3

int test(char *url)

{
  CURL **ppCVar1;
  int iVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  void *__ptr;
  undefined8 uVar10;
  long lVar11;
  CURL *pCVar12;
  long lVar13;
  ulong uVar14;
  int *piVar15;
  char *pcVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  timeval tVar19;
  int maxfd;
  int running;
  long timeout;
  timeval interval;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_1d8;
  int local_1d4;
  long local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  sVar9 = strlen(url);
  sVar9 = sVar9 + 5;
  __ptr = malloc(sVar9);
  tv_test_start = tutil_tvnow();
  if (__ptr == (void *)0x0) {
    curl_mfprintf(_stderr,"Not enough memory for full url\n");
    iVar6 = 0x7e;
  }
  else {
    easy[0] = (CURL *)0x0;
    easy[1] = (CURL *)0x0;
    easy[2] = (CURL *)0x0;
    sockets[0] = -1;
    sockets[1] = -1;
    sockets[2] = -1;
    iVar6 = curl_global_init(3);
    uVar18 = _stderr;
    if (iVar6 == 0) {
      if (res == 0) {
        lVar11 = curl_multi_init();
        if (lVar11 == 0) {
          curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                        ,0x7f);
          res = 0x7b;
        }
        else if (res == 0) {
          cVar5 = '\0';
          uVar7 = 0;
LAB_00102404:
          do {
            local_1d0 = -99;
            local_1d8 = -99;
            cVar4 = cVar5;
            if (cVar5 == '\0') {
              pCVar12 = (CURL *)curl_easy_init();
              easy[(int)uVar7] = pCVar12;
              if (pCVar12 == (CURL *)0x0) {
                curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x92);
                res = 0x7c;
              }
              else if (res == 0) {
                ppCVar1 = easy + (int)uVar7;
                if ((int)uVar7 % 3 == 2) {
                  curl_msnprintf(__ptr,sVar9,"%s0200",url);
                  iVar6 = curl_easy_setopt(*ppCVar1,0x6b,8);
                  uVar18 = _stderr;
                  if (iVar6 == 0) {
LAB_001024e7:
                    if (res != 0) break;
                    iVar6 = curl_easy_setopt(*ppCVar1,0x4a,1);
                    uVar18 = _stderr;
                    if (iVar6 == 0) {
                      if (res != 0) break;
                      iVar6 = curl_easy_setopt(*ppCVar1,0x2712,__ptr);
                      uVar18 = _stderr;
                      if (iVar6 == 0) {
                        if (res != 0) break;
                        iVar6 = curl_easy_setopt(*ppCVar1,0x29,1);
                        uVar18 = _stderr;
                        if (iVar6 == 0) {
                          if (res != 0) break;
                          iVar6 = curl_easy_setopt(*ppCVar1,0x50,1);
                          uVar18 = _stderr;
                          if (iVar6 == 0) {
                            if (res != 0) break;
                            iVar6 = curl_easy_setopt(*ppCVar1,0x2715,"testuser:testpass");
                            uVar18 = _stderr;
                            if (iVar6 == 0) {
                              if (res != 0) break;
                              iVar6 = curl_easy_setopt(*ppCVar1,0x4e2b,callback);
                              uVar18 = _stderr;
                              if (iVar6 == 0) {
                                if (res != 0) break;
                                iVar6 = curl_easy_setopt(*ppCVar1,0x2711);
                                uVar18 = _stderr;
                                if (iVar6 == 0) {
                                  if (res != 0) break;
                                  iVar6 = curl_easy_setopt(*ppCVar1,0x2a,1);
                                  uVar18 = _stderr;
                                  if (iVar6 == 0) {
                                    if (res != 0) break;
                                    iVar6 = curl_multi_add_handle(lVar11,*ppCVar1);
                                    uVar18 = _stderr;
                                    if (iVar6 == 0) {
                                      if (res == 0) {
                                        uVar7 = uVar7 + 1;
                                        cVar4 = '\x01';
                                        goto LAB_00102690;
                                      }
                                      break;
                                    }
                                    uVar10 = curl_multi_strerror(iVar6);
                                    pcVar16 = 
                                    "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                                    uVar17 = 0xa5;
                                  }
                                  else {
                                    uVar10 = curl_easy_strerror(iVar6);
                                    pcVar16 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n"
                                    ;
                                    uVar17 = 0xa3;
                                  }
                                }
                                else {
                                  uVar10 = curl_easy_strerror(iVar6);
                                  pcVar16 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                  uVar17 = 0xa2;
                                }
                              }
                              else {
                                uVar10 = curl_easy_strerror(iVar6);
                                pcVar16 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                uVar17 = 0xa1;
                              }
                            }
                            else {
                              uVar10 = curl_easy_strerror(iVar6);
                              pcVar16 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                              uVar17 = 0xa0;
                            }
                          }
                          else {
                            uVar10 = curl_easy_strerror(iVar6);
                            pcVar16 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                            uVar17 = 0x9f;
                          }
                        }
                        else {
                          uVar10 = curl_easy_strerror(iVar6);
                          pcVar16 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                          uVar17 = 0x9e;
                        }
                      }
                      else {
                        uVar10 = curl_easy_strerror(iVar6);
                        pcVar16 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                        uVar17 = 0x9d;
                      }
                    }
                    else {
                      uVar10 = curl_easy_strerror(iVar6);
                      pcVar16 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                      uVar17 = 0x9c;
                    }
                  }
                  else {
                    uVar10 = curl_easy_strerror(iVar6);
                    pcVar16 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uVar17 = 0x96;
                  }
                }
                else {
                  curl_msnprintf(__ptr,sVar9,"%s0100",url);
                  iVar6 = curl_easy_setopt(*ppCVar1,0x6b,1);
                  uVar18 = _stderr;
                  if (iVar6 == 0) goto LAB_001024e7;
                  uVar10 = curl_easy_strerror(iVar6);
                  pcVar16 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                  uVar17 = 0x9a;
                }
LAB_00102e7a:
                curl_mfprintf(uVar18,pcVar16,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,uVar17,iVar6,uVar10);
                res = iVar6;
              }
              break;
            }
LAB_00102690:
            iVar6 = curl_multi_perform(lVar11,&local_1d4);
            uVar18 = _stderr;
            if (iVar6 != 0) {
              uVar10 = curl_multi_strerror(iVar6);
              pcVar16 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
              uVar17 = 0xaa;
              goto LAB_00102e7a;
            }
            if (local_1d4 < 0) {
              pcVar16 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uVar18 = 0xaa;
LAB_00102b62:
              curl_mfprintf(_stderr,pcVar16,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,uVar18);
              res = 0x7a;
              break;
            }
            if (res != 0) break;
            tVar19 = tutil_tvnow();
            lVar13 = tutil_tvdiff(tVar19,tv_test_start);
            if (5000 < lVar13) {
              uVar18 = 0xac;
LAB_00102c64:
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,uVar18);
              res = 0x7d;
              break;
            }
            if ((res != 0) || ((cVar4 == '\x02' && (local_1d4 == 0)))) break;
            local_1b8.__fds_bits[0xe] = 0;
            local_1b8.__fds_bits[0xf] = 0;
            local_1b8.__fds_bits[0xc] = 0;
            local_1b8.__fds_bits[0xd] = 0;
            local_1b8.__fds_bits[10] = 0;
            local_1b8.__fds_bits[0xb] = 0;
            local_1b8.__fds_bits[8] = 0;
            local_1b8.__fds_bits[9] = 0;
            local_1b8.__fds_bits[6] = 0;
            local_1b8.__fds_bits[7] = 0;
            local_1b8.__fds_bits[4] = 0;
            local_1b8.__fds_bits[5] = 0;
            local_1b8.__fds_bits[2] = 0;
            local_1b8.__fds_bits[3] = 0;
            local_1b8.__fds_bits[0] = 0;
            local_1b8.__fds_bits[1] = 0;
            local_b8.__fds_bits[0] = 0;
            local_b8.__fds_bits[1] = 0;
            local_b8.__fds_bits[2] = 0;
            local_b8.__fds_bits[3] = 0;
            local_b8.__fds_bits[4] = 0;
            local_b8.__fds_bits[5] = 0;
            local_b8.__fds_bits[6] = 0;
            local_b8.__fds_bits[7] = 0;
            local_b8.__fds_bits[8] = 0;
            local_b8.__fds_bits[9] = 0;
            local_b8.__fds_bits[10] = 0;
            local_b8.__fds_bits[0xb] = 0;
            local_b8.__fds_bits[0xc] = 0;
            local_b8.__fds_bits[0xd] = 0;
            local_b8.__fds_bits[0xe] = 0;
            local_b8.__fds_bits[0xf] = 0;
            local_138.__fds_bits[0] = 0;
            local_138.__fds_bits[1] = 0;
            local_138.__fds_bits[2] = 0;
            local_138.__fds_bits[3] = 0;
            local_138.__fds_bits[4] = 0;
            local_138.__fds_bits[5] = 0;
            local_138.__fds_bits[6] = 0;
            local_138.__fds_bits[7] = 0;
            local_138.__fds_bits[8] = 0;
            local_138.__fds_bits[9] = 0;
            local_138.__fds_bits[10] = 0;
            local_138.__fds_bits[0xb] = 0;
            local_138.__fds_bits[0xc] = 0;
            local_138.__fds_bits[0xd] = 0;
            local_138.__fds_bits[0xe] = 0;
            local_138.__fds_bits[0xf] = 0;
            iVar6 = curl_multi_fdset(lVar11,&local_1b8,&local_b8,&local_138,&local_1d8);
            uVar18 = _stderr;
            if (iVar6 != 0) {
              uVar10 = curl_multi_strerror(iVar6);
              pcVar16 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
              uVar17 = 0xb5;
              goto LAB_00102e7a;
            }
            if (local_1d8 < -1) {
              pcVar16 = 
              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
              uVar18 = 0xb5;
              goto LAB_00102b62;
            }
            if (res != 0) break;
            if (local_1d8 < 0) {
              cVar5 = '\x02';
              if (cVar4 == '\x01') goto LAB_001028d1;
            }
            else {
              iVar6 = uVar7 - 1;
              uVar14 = 0;
              bVar3 = false;
              do {
                while (iVar8 = (int)uVar14,
                      ((ulong)local_1b8.__fds_bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
LAB_00102881:
                  uVar14 = (ulong)(iVar8 + 1);
                  if (iVar8 == local_1d8) {
                    cVar5 = '\x02';
                    if (cVar4 != '\x01') goto LAB_001028dc;
                    if (!bVar3) {
                      curl_mfprintf(_stderr,
                                    "Warning: socket did not open immediately for new handle (trying again)\n"
                                   );
                      cVar5 = '\x01';
                      goto LAB_00102404;
                    }
                    goto LAB_001028d1;
                  }
                }
                if (0 < (int)uVar7) {
                  lVar13 = 0;
                  do {
                    if (*(int *)((long)sockets + lVar13) == iVar8) goto LAB_00102881;
                    lVar13 = lVar13 + 4;
                  } while ((ulong)uVar7 << 2 != lVar13);
                }
                if (!(bool)(cVar4 == '\x01' & (bVar3 ^ 1U))) {
                  curl_mfprintf(_stderr,"Unexpected new socket\n");
LAB_00102a9a:
                  res = 0x7e;
                  goto LAB_00102e8d;
                }
                iVar2 = sockets[iVar6];
                if (iVar2 != -1) {
                  if (iVar8 == iVar2) {
                    __assert_fail("curfd != sockets[num_handles-1]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0xd8,"int test(char *)");
                  }
                  curl_mfprintf(_stderr,"Handle %d wrote to socket %d then detected on %d\n",iVar6,
                                iVar2,uVar14);
                  goto LAB_00102a9a;
                }
                sockets[iVar6] = iVar8;
                bVar3 = true;
                uVar14 = (ulong)(iVar8 + 1);
              } while (iVar8 != local_1d8);
LAB_001028d1:
              cVar5 = (2 < (int)uVar7) * '\x02';
            }
LAB_001028dc:
            iVar6 = curl_multi_timeout(lVar11,&local_1d0);
            uVar18 = _stderr;
            if (iVar6 != 0) {
              uVar10 = curl_multi_strerror(iVar6);
              pcVar16 = "%s:%d curl_multi_timeout() failed, with code %d (%s)\n";
              uVar17 = 0xef;
              goto LAB_00102e7a;
            }
            if (local_1d0 < -1) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xef,local_1d0);
              res = 0x73;
              break;
            }
            if (res != 0) break;
            curl_mfprintf(_stderr,"%s:%d num_handles %d timeout %ld\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xf4);
            if (local_1d0 == -1) {
              local_1c8.tv_sec = 6;
              local_1c8.tv_usec = 0;
              if (uVar7 == 3 && local_1d4 == 0) break;
            }
            else {
              lVar13 = local_1d0;
              if (0x7ffffffe < local_1d0) {
                lVar13 = 0x7fffffff;
              }
              local_1c8.tv_sec = (__time_t)((int)lVar13 / 1000);
              local_1c8.tv_usec = (__suseconds_t)(((int)lVar13 % 1000) * 1000);
            }
            iVar6 = select_wrapper(local_1d8 + 1,&local_1b8,&local_b8,&local_138,&local_1c8);
            if (iVar6 == -1) {
              piVar15 = __errno_location();
              uVar18 = _stderr;
              iVar6 = *piVar15;
              pcVar16 = strerror(iVar6);
              curl_mfprintf(uVar18,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x107,iVar6,pcVar16);
              res = 0x79;
              break;
            }
            if (res != 0) break;
            tVar19 = tutil_tvnow();
            lVar13 = tutil_tvdiff(tVar19,tv_test_start);
            if (5000 < lVar13) {
              uVar18 = 0x109;
              goto LAB_00102c64;
            }
          } while (res == 0);
        }
LAB_00102e8d:
        lVar13 = 0;
        do {
          curl_multi_remove_handle(lVar11,*(undefined8 *)((long)easy + lVar13));
          curl_easy_cleanup(*(undefined8 *)((long)easy + lVar13));
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x18);
        curl_multi_cleanup(lVar11);
        curl_global_cleanup();
        free(__ptr);
        iVar6 = res;
        goto LAB_001023c7;
      }
    }
    else {
      uVar10 = curl_easy_strerror(iVar6);
      curl_mfprintf(uVar18,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                    ,0x79,iVar6,uVar10);
      res = iVar6;
    }
    iVar6 = res;
    free(__ptr);
  }
LAB_001023c7:
  return iVar6;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i, j;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  size_t urllen = strlen(url) + 4 + 1;
  char *full_url = malloc(urllen);

  start_test_timing();

  if(!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return TEST_ERR_MAJOR_BAD;
  }

  for(i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = CURL_SOCKET_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    free(full_url);
    return res;
  }

  multi_init(multi);

#ifdef USE_PIPELINING
  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);
  multi_setopt(multi, CURLMOPT_MAX_HOST_CONNECTIONS, 5L);
  multi_setopt(multi, CURLMOPT_MAX_TOTAL_CONNECTIONS, 10L);
#endif

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    int maxfd = -99;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if(state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if(num_handles % 3 == 2) {
        snprintf(full_url, urllen, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      }
      else {
        snprintf(full_url, urllen, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    /* Any socket which is new in fdread is associated with the new handle */
    for(i = 0; i <= maxfd; ++i) {
      bool socket_exists = FALSE;
      curl_socket_t curfd = (curl_socket_t)i;

      if(!FD_ISSET(curfd, &fdread)) {
        continue;
      }

      /* Check if this socket was already detected for an earlier handle (or
         for this handle, num_handles-1, in the callback */
      for(j = 0; j < num_handles; ++j) {
        if(sockets[j] == curfd) {
          socket_exists = TRUE;
          break;
        }
      }
      if(socket_exists) {
        continue;
      }

      if(found_new_socket || state != NeedSocketForNewHandle) {
        fprintf(stderr, "Unexpected new socket\n");
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }

      /* Now we know the socket is for the most recent handle, num_handles-1 */
      if(sockets[num_handles-1] != CURL_SOCKET_BAD) {
        /* A socket for this handle was already detected in the callback; if it
           matched socket_exists should be true and we would never get here */
        assert(curfd != sockets[num_handles-1]);
        fprintf(stderr, "Handle %d wrote to socket %d then detected on %d\n",
                num_handles-1, (int)sockets[num_handles-1], (int)curfd);
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }
      else {
        sockets[num_handles-1] = curfd;
        found_new_socket = TRUE;
        /* continue to make sure there's only one new handle */
      }
    }

    if(state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld\n",
            __FILE__, __LINE__, num_handles, timeout);

    if(timeout != -1L) {
      int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
      interval.tv_sec = itimeout/1000;
      interval.tv_usec = (itimeout%1000)*1000;
    }
    else {
      interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
      interval.tv_usec = 0;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < MAX_EASY_HANDLES; i++) {
    curl_multi_remove_handle(multi, easy[i]);
    curl_easy_cleanup(easy[i]);
  }

  curl_multi_cleanup(multi);
  curl_global_cleanup();

  free(full_url);

  return res;
}